

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  byte bVar1;
  uchar *ttf_data;
  ImFont *pIVar2;
  ushort *puVar3;
  ushort *puVar4;
  uint uVar5;
  ulong uVar6;
  uchar *puVar7;
  uint ttf_size;
  bool bVar8;
  ImFontConfig font_cfg;
  ImFontConfig local_b8;
  
  uVar5 = *(uint *)((long)compressed_ttf_data + 8);
  ttf_size = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  ttf_data = (uchar *)ImGui::MemAlloc((ulong)ttf_size);
  uVar5 = *compressed_ttf_data;
  if (((uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) ==
       0x57bc0000) &&
     (uVar5 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar5 >> 0x18 == 0 && (uVar5 & 0xff0000) == 0) && (uVar5 & 0xff00) == 0) &&
     (uVar5 & 0xff) == 0)) {
    uVar5 = *(uint *)((long)compressed_ttf_data + 8);
    puVar7 = ttf_data +
             (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18);
    puVar4 = (ushort *)((long)compressed_ttf_data + 0x10);
    stb__barrier_in_b = (uchar *)compressed_ttf_data;
    stb__barrier_out_e = puVar7;
    stb__barrier_out_b = ttf_data;
    stb__dout = ttf_data;
    do {
      bVar1 = (byte)*puVar4;
      uVar5 = (uint)bVar1;
      if (bVar1 < 0x20) {
        if (bVar1 < 0x18) {
          if (bVar1 < 0x10) {
            if (bVar1 < 8) {
              if (bVar1 == 4) {
                stb__match(stb__dout +
                           ~((ulong)*(byte *)((long)puVar4 + 3) |
                             (ulong)*(byte *)((long)puVar4 + 1) << 0x10 |
                            (ulong)(byte)puVar4[1] << 8),
                           (ushort)(puVar4[2] << 8 | puVar4[2] >> 8) + 1);
                puVar3 = puVar4 + 3;
              }
              else {
                if (uVar5 == 6) {
                  uVar6 = ~((ulong)*(byte *)((long)puVar4 + 3) |
                            (ulong)*(byte *)((long)puVar4 + 1) << 0x10 | (ulong)(byte)puVar4[1] << 8
                           );
                  uVar5 = (uint)(byte)puVar4[2];
                  goto LAB_001344bf;
                }
                puVar3 = puVar4;
                if (uVar5 == 7) {
                  stb__lit((byte *)((long)puVar4 + 3),
                           (ushort)(*(ushort *)((long)puVar4 + 1) << 8 |
                                   *(ushort *)((long)puVar4 + 1) >> 8) + 1);
                  puVar3 = (ushort *)
                           ((long)puVar4 +
                           (ulong)(ushort)(*(ushort *)((long)puVar4 + 1) << 8 |
                                          *(ushort *)((long)puVar4 + 1) >> 8) + 4);
                }
              }
            }
            else {
              stb__lit((uchar *)(puVar4 + 1),
                       ((uint)bVar1 * 0x100 + (uint)*(byte *)((long)puVar4 + 1)) - 0x7ff);
              puVar3 = (ushort *)
                       ((long)puVar4 + ((ulong)(ushort)(*puVar4 << 8 | *puVar4 >> 8) - 0x7fd));
            }
          }
          else {
            uVar6 = -(ulong)(((uint)*(byte *)((long)puVar4 + 1) * 0x100 +
                             ((uint)(byte)puVar4[1] | (uint)bVar1 << 0x10)) - 0xfffff);
            uVar5 = (uint)(ushort)(*(ushort *)((long)puVar4 + 3) << 8 |
                                  *(ushort *)((long)puVar4 + 3) >> 8);
LAB_001344bf:
            stb__match(stb__dout + uVar6,uVar5 + 1);
            puVar3 = (ushort *)((long)puVar4 + 5);
          }
        }
        else {
          stb__match(stb__dout +
                     -(ulong)(((uint)*(byte *)((long)puVar4 + 1) * 0x100 +
                              ((uint)(byte)puVar4[1] | (uint)bVar1 << 0x10)) - 0x17ffff),
                     *(byte *)((long)puVar4 + 3) + 1);
          puVar3 = puVar4 + 2;
        }
      }
      else if ((char)bVar1 < '\0') {
        stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar4 + 1),uVar5 - 0x7f);
        puVar3 = puVar4 + 1;
      }
      else if (bVar1 < 0x40) {
        stb__lit((byte *)((long)puVar4 + 1),uVar5 - 0x1f);
        puVar3 = (ushort *)((long)puVar4 + ((ulong)(byte)*puVar4 - 0x1e));
      }
      else {
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar4 + 1) + (uint)bVar1 * 0x100) - 0x3fff),
                   (byte)puVar4[1] + 1);
        puVar3 = (ushort *)((long)puVar4 + 3);
      }
      if (puVar3 == puVar4) {
        if (((byte)*puVar3 != 5) || (*(byte *)((long)puVar3 + 1) != 0xfa)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                        ,0xfc5,
                        "unsigned int stb_decompress(unsigned char *, const unsigned char *, unsigned int)"
                       );
        }
        if (stb__dout != puVar7) {
          __assert_fail("stb__dout == output + olen",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                        ,0xfbf,
                        "unsigned int stb_decompress(unsigned char *, const unsigned char *, unsigned int)"
                       );
        }
      }
      else if (puVar7 < stb__dout) {
        __assert_fail("stb__dout <= output + olen",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                      ,0xfc9,
                      "unsigned int stb_decompress(unsigned char *, const unsigned char *, unsigned int)"
                     );
      }
      bVar8 = puVar3 != puVar4;
      puVar4 = puVar3;
    } while (bVar8);
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    memset(&local_b8,0,0x88);
    local_b8.FontDataOwnedByAtlas = true;
    local_b8.OversampleH = 3;
    local_b8.OversampleV = 1;
    local_b8.GlyphMaxAdvanceX = 3.4028235e+38;
    local_b8.RasterizerMultiply = 1.0;
    local_b8.EllipsisChar = 0xffff;
  }
  else {
    memcpy(&local_b8,font_cfg_template,0x88);
  }
  if (local_b8.FontData != (void *)0x0) {
    __assert_fail("font_cfg.FontData == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0x87c,
                  "ImFont *ImFontAtlas::AddFontFromMemoryCompressedTTF(const void *, int, float, const ImFontConfig *, const ImWchar *)"
                 );
  }
  local_b8.FontDataOwnedByAtlas = true;
  pIVar2 = AddFontFromMemoryTTF(this,ttf_data,ttf_size,size_pixels,&local_b8,glyph_ranges);
  return pIVar2;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char*)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}